

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall mp::internal::SignalHandler::~SignalHandler(SignalHandler *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Interrupter)._vptr_Interrupter = (_func_int **)&PTR__SignalHandler_005d4350;
  this->solver_->interrupter_ = &this->solver_->super_Interrupter;
  stop_ = 1;
  LOCK();
  handler_ = 0;
  UNLOCK();
  LOCK();
  signal_message_size_ = 0;
  UNLOCK();
  pcVar1 = (this->message_)._M_dataplus._M_p;
  paVar2 = &(this->message_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SignalHandler::~SignalHandler() {
  solver_.set_interrupter(0);
  stop_ = 1;
  handler_ = 0;
  signal_message_size_ = 0;
}